

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitMapped(SplitToolPrivate *this)

{
  bool bVar1;
  BamWriter *pBVar2;
  reference ppVar3;
  pair<bool,_BamTools::BamWriter_*> pVar4;
  __enable_if_t<is_constructible<value_type,_pair<bool,_BamWriter_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  string outputFilename;
  bool isCurrentAlignmentMapped;
  BamWriter *writer;
  BamAlignment al;
  iterator writerIter;
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  outputFiles;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  _Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> in_stack_fffffffffffffd60;
  RuleToken *in_stack_fffffffffffffd68;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  ostream *in_stack_fffffffffffffd78;
  SplitToolPrivate *in_stack_fffffffffffffd80;
  RuleToken *in_stack_fffffffffffffd88;
  BamAlignment *in_stack_fffffffffffffda0;
  string local_210 [32];
  string local_1f0 [32];
  _Self local_1d0;
  _Base_ptr local_1c8;
  undefined1 local_1b9;
  BamWriter *local_1b8;
  BamAlignment local_1a0;
  _Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> local_48 [8];
  byte local_1;
  
  std::
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  ::map((map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
         *)0x23e0d9);
  std::_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_>::_Rb_tree_iterator(local_48)
  ;
  BamAlignment::BamAlignment(in_stack_fffffffffffffda0);
  while (bVar1 = BamReader::GetNextAlignment
                           ((BamReader *)in_stack_fffffffffffffd60._M_node,
                            (BamAlignment *)
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58)), bVar1) {
    local_1b9 = BamAlignment::IsMapped(&local_1a0);
    local_1c8 = (_Base_ptr)
                std::
                map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
                ::find((map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58),
                       (key_type *)0x23e155);
    local_48[0]._M_node = local_1c8;
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
         ::end((map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
                *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    bVar1 = std::operator==(local_48,&local_1d0);
    if (bVar1) {
      std::operator+(in_stack_fffffffffffffd88,(RuleToken *)in_stack_fffffffffffffd80);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60._M_node);
      std::__cxx11::string::~string(local_210);
      pBVar2 = (BamWriter *)operator_new(8);
      BamWriter::BamWriter
                ((BamWriter *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      local_1b8 = pBVar2;
      bVar1 = BamWriter::Open((BamWriter *)
                              CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                              (string *)in_stack_fffffffffffffd68,
                              (string *)in_stack_fffffffffffffd60._M_node,
                              (RefVector *)
                              CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      if (bVar1) {
        pVar4 = std::make_pair<bool&,BamTools::BamWriter*&>
                          ((bool *)in_stack_fffffffffffffd60._M_node,
                           (BamWriter **)
                           CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        in_stack_fffffffffffffd68 = (RuleToken *)pVar4.second;
        in_stack_fffffffffffffd77 = pVar4.first;
        _Var5 = std::
                map<bool,BamTools::BamWriter*,std::less<bool>,std::allocator<std::pair<bool_const,BamTools::BamWriter*>>>
                ::insert<std::pair<bool,BamTools::BamWriter*>>
                          ((map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
                            *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70),
                           (pair<bool,_BamTools::BamWriter_*> *)in_stack_fffffffffffffd68);
        in_stack_fffffffffffffd60 = _Var5.first._M_node;
        in_stack_fffffffffffffd5f = _Var5.second;
      }
      else {
        in_stack_fffffffffffffd88 =
             (RuleToken *)
             std::operator<<((ostream *)&std::cerr,"bamtools split ERROR: could not open ");
        in_stack_fffffffffffffd80 =
             (SplitToolPrivate *)std::operator<<((ostream *)in_stack_fffffffffffffd88,local_1f0);
        in_stack_fffffffffffffd78 =
             std::operator<<((ostream *)in_stack_fffffffffffffd80," for writing.");
        std::ostream::operator<<(in_stack_fffffffffffffd78,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_1f0);
      if (!bVar1) goto LAB_0023e49d;
    }
    else {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_bool,_BamTools::BamWriter_*>_> *)
                          0x23e441);
      local_1b8 = ppVar3->second;
    }
    if (local_1b8 != (BamWriter *)0x0) {
      BamWriter::SaveAlignment
                ((BamWriter *)in_stack_fffffffffffffd60._M_node,
                 (BamAlignment *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    }
  }
  CloseWriters<bool>(in_stack_fffffffffffffd80,
                     (map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
                      *)in_stack_fffffffffffffd78);
  local_1 = 1;
LAB_0023e49d:
  BamAlignment::~BamAlignment((BamAlignment *)in_stack_fffffffffffffd60._M_node);
  std::
  map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
  ::~map((map<bool,_BamTools::BamWriter_*,_std::less<bool>,_std::allocator<std::pair<const_bool,_BamTools::BamWriter_*>_>_>
          *)0x23e4b7);
  return (bool)(local_1 & 1);
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitMapped()
{

    // set up splitting data structure
    std::map<bool, BamWriter*> outputFiles;
    std::map<bool, BamWriter*>::iterator writerIter;

    // iterate through alignments
    BamAlignment al;
    BamWriter* writer;
    bool isCurrentAlignmentMapped;
    while (m_reader.GetNextAlignment(al)) {

        // see if bool value exists
        isCurrentAlignmentMapped = al.IsMapped();
        writerIter = outputFiles.find(isCurrentAlignmentMapped);

        // if no writer associated with this value
        if (writerIter == outputFiles.end()) {

            // open new BamWriter
            const std::string outputFilename =
                m_outputFilenameStub +
                (isCurrentAlignmentMapped ? SPLIT_MAPPED_TOKEN : SPLIT_UNMAPPED_TOKEN) + ".bam";
            writer = new BamWriter;
            if (!writer->Open(outputFilename, m_header, m_references)) {
                std::cerr << "bamtools split ERROR: could not open " << outputFilename
                          << " for writing." << std::endl;
                return false;
            }

            // store in map
            outputFiles.insert(std::make_pair(isCurrentAlignmentMapped, writer));
        }

        // else grab corresponding writer
        else
            writer = (*writerIter).second;

        // store alignment in proper BAM output file
        if (writer) writer->SaveAlignment(al);
    }

    // clean up BamWriters
    CloseWriters(outputFiles);

    // return success
    return true;
}